

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void cmCTestTestHandler::AddConfigurations
               (cmCTest *ctest,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *attempted,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *attemptedConfigs,string *filepath,string *filename)

{
  ulong uVar1;
  char *pcVar2;
  string *psVar3;
  allocator local_191;
  value_type local_190;
  allocator local_169;
  value_type local_168;
  allocator local_141;
  value_type local_140;
  allocator local_119;
  value_type local_118;
  allocator local_f1;
  value_type local_f0;
  allocator local_c9;
  value_type local_c8;
  allocator local_a1;
  value_type local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_50 [8];
  string tempPath;
  string *filename_local;
  string *filepath_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *attemptedConfigs_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *attempted_local;
  cmCTest *ctest_local;
  
  tempPath.field_2._8_8_ = filename;
  std::__cxx11::string::string((string *)local_50);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::size();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)filepath);
    if (*pcVar2 != '/') {
      std::__cxx11::string::operator+=((string *)filepath,"/");
    }
  }
  std::operator+(&local_80,filepath,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 tempPath.field_2._8_8_);
  std::__cxx11::string::operator=((string *)local_50,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(attempted,(value_type *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"",&local_a1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(attemptedConfigs,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  cmCTest::GetConfigType_abi_cxx11_(ctest);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_50,(string *)filepath);
    psVar3 = cmCTest::GetConfigType_abi_cxx11_(ctest);
    std::__cxx11::string::operator+=((string *)local_50,(string *)psVar3);
    std::__cxx11::string::operator+=((string *)local_50,"/");
    std::__cxx11::string::operator+=((string *)local_50,(string *)tempPath.field_2._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,(value_type *)local_50);
    psVar3 = cmCTest::GetConfigType_abi_cxx11_(ctest);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attemptedConfigs,psVar3);
    psVar3 = cmCTest::GetConfigType_abi_cxx11_(ctest);
    std::__cxx11::string::operator=((string *)local_50,(string *)psVar3);
    std::__cxx11::string::operator+=((string *)local_50,"/");
    std::__cxx11::string::operator+=((string *)local_50,(string *)filepath);
    std::__cxx11::string::operator+=((string *)local_50,(string *)tempPath.field_2._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,(value_type *)local_50);
    psVar3 = cmCTest::GetConfigType_abi_cxx11_(ctest);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attemptedConfigs,psVar3);
  }
  else {
    std::__cxx11::string::operator=((string *)local_50,(string *)filepath);
    std::__cxx11::string::operator+=((string *)local_50,"Release/");
    std::__cxx11::string::operator+=((string *)local_50,(string *)tempPath.field_2._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,(value_type *)local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"Release",&local_c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attemptedConfigs,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::operator=((string *)local_50,(string *)filepath);
    std::__cxx11::string::operator+=((string *)local_50,"Debug/");
    std::__cxx11::string::operator+=((string *)local_50,(string *)tempPath.field_2._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,(value_type *)local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,"Debug",&local_f1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attemptedConfigs,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    std::__cxx11::string::operator=((string *)local_50,(string *)filepath);
    std::__cxx11::string::operator+=((string *)local_50,"MinSizeRel/");
    std::__cxx11::string::operator+=((string *)local_50,(string *)tempPath.field_2._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,(value_type *)local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,"MinSizeRel",&local_119);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attemptedConfigs,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    std::__cxx11::string::operator=((string *)local_50,(string *)filepath);
    std::__cxx11::string::operator+=((string *)local_50,"RelWithDebInfo/");
    std::__cxx11::string::operator+=((string *)local_50,(string *)tempPath.field_2._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,(value_type *)local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_140,"RelWithDebInfo",&local_141);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attemptedConfigs,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    std::__cxx11::string::operator=((string *)local_50,(string *)filepath);
    std::__cxx11::string::operator+=((string *)local_50,"Deployment/");
    std::__cxx11::string::operator+=((string *)local_50,(string *)tempPath.field_2._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,(value_type *)local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,"Deployment",&local_169);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attemptedConfigs,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    std::__cxx11::string::operator=((string *)local_50,(string *)filepath);
    std::__cxx11::string::operator+=((string *)local_50,"Development/");
    std::__cxx11::string::operator+=((string *)local_50,(string *)tempPath.field_2._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attempted,(value_type *)local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_190,"Deployment",&local_191);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(attemptedConfigs,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmCTestTestHandler
::AddConfigurations(cmCTest *ctest,
                    std::vector<std::string> &attempted,
                    std::vector<std::string> &attemptedConfigs,
                    std::string filepath,
                    std::string &filename)
{
  std::string tempPath;

  if (!filepath.empty() &&
      filepath[filepath.size()-1] != '/')
    {
    filepath += "/";
    }
  tempPath = filepath + filename;
  attempted.push_back(tempPath);
  attemptedConfigs.push_back("");

  if(!ctest->GetConfigType().empty())
    {
    tempPath = filepath;
    tempPath += ctest->GetConfigType();
    tempPath += "/";
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back(ctest->GetConfigType());
    // If the file is an OSX bundle then the configtype
    // will be at the start of the path
    tempPath = ctest->GetConfigType();
    tempPath += "/";
    tempPath += filepath;
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back(ctest->GetConfigType());
    }
  else
    {
    // no config specified - try some options...
    tempPath = filepath;
    tempPath += "Release/";
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back("Release");
    tempPath = filepath;
    tempPath += "Debug/";
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back("Debug");
    tempPath = filepath;
    tempPath += "MinSizeRel/";
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back("MinSizeRel");
    tempPath = filepath;
    tempPath += "RelWithDebInfo/";
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back("RelWithDebInfo");
    tempPath = filepath;
    tempPath += "Deployment/";
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back("Deployment");
    tempPath = filepath;
    tempPath += "Development/";
    tempPath += filename;
    attempted.push_back(tempPath);
    attemptedConfigs.push_back("Deployment");
    }
}